

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gabby.cc
# Opt level: O2

void __thiscall GB::StepDMA(GB *this)

{
  long lVar1;
  long lVar2;
  u8 uVar3;
  ulong uVar4;
  
  lVar1 = (this->s).tick;
  lVar2 = (this->s).dma_start_tick;
  uVar4 = lVar1 - lVar2;
  if (lVar2 <= lVar1) {
    (this->s).dma_active = true;
    if ((long)uVar4 < 0x500) {
      if (((uint)uVar4 & 0x7ff00) < 0x500 && ((uint)lVar1 & 7) == 6) {
        uVar3 = Read(this,(this->s).dma_addr + (short)(uVar4 >> 3));
        (this->s).oam[uVar4 >> 3 & 0xffff] = uVar3;
      }
    }
    else {
      (this->s).dma_start_tick = 0x7fffffffffffffff;
      (this->s).dma_active = false;
    }
  }
  return;
}

Assistant:

void GB::StepDMA() {
  if (s.tick >= s.dma_start_tick) {
    s.dma_active = true;
    Tick delta = s.tick - s.dma_start_tick;
    if (delta >= DMA_TIME) {
      DPRINT(DMA, "dma finished\n");
      s.dma_start_tick = MaxTick;
      s.dma_active = false;
      return;
    }

    if ((s.tick & 7) == 6) {
      u16 offset = delta >> 3;
      if (offset < 160) {
        s.oam[offset] = Read(s.dma_addr + offset);
      }
    }
  }
}